

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O3

bool __thiscall SubCircuit<0>::propagateSCC(SubCircuit<0> *this,int root)

{
  int *piVar1;
  PROP *pPVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  Lit LVar7;
  Lit LVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  IntVar *pIVar15;
  vec<int> *pvVar16;
  vec<int> *pvVar17;
  vec<SubCircuit<0>::PROP> *pvVar18;
  uint uVar19;
  uint uVar20;
  vec<int> *pvVar21;
  Clause *pCVar22;
  uint i;
  ulong uVar23;
  undefined1 auVar24 [8];
  Clause *c;
  int backto;
  int backfrom;
  int numback;
  vec<int> local_2a8;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  bool local_288;
  int local_27c;
  vec<int> local_278;
  vec<int> local_268;
  uint local_24c;
  ulong local_248;
  int local_240;
  int local_23c;
  vec<int> local_238;
  int local_21c;
  int local_218;
  int local_214;
  vec<int> *local_210;
  vec<int> *local_208;
  Clause *local_200;
  vec<SubCircuit<0>::PROP> *local_1f8;
  int **local_1f0;
  vec<int> local_1e8;
  vec<int> local_1d8;
  vec<int> local_1c8;
  vec<int> local_1b8;
  vec<int> local_1a8;
  vec<int> local_198;
  vec<int> local_188;
  vec<int> local_178;
  vec<int> local_168;
  vec<int> local_158;
  vec<int> local_148;
  vec<int> local_138;
  vec<int> local_128;
  vec<int> local_118;
  vec<int> local_108;
  vec<int> local_f8;
  vec<int> local_e8;
  vec<int> local_d8;
  vec<int> local_c8;
  vec<int> local_b8;
  vec<int> local_a8;
  vec<int> local_98;
  vec<int> local_88;
  vec<int> local_78;
  vec<int> local_68;
  int local_54;
  ulong local_50;
  vec<int> *local_48;
  IntVar *local_40;
  long local_38;
  
  local_23c = 0;
  local_240 = 0;
  local_214 = 0;
  local_2a8.sz = 0;
  local_2a8.cap = 0;
  local_2a8.data = (int *)0x0;
  local_24c = root;
  vec<int>::reserve(&local_2a8,*(uint *)&(this->super_Propagator).field_0x14);
  pvVar17 = &this->prev;
  if ((this->prev).data != (int *)0x0) {
    pvVar17->sz = 0;
  }
  local_208 = &this->earlier;
  if ((this->earlier).data != (int *)0x0) {
    local_208->sz = 0;
  }
  pvVar21 = &this->later;
  if ((this->later).data != (int *)0x0) {
    pvVar21->sz = 0;
  }
  piVar1 = this->index;
  if (0 < *(int *)&(this->super_Propagator).field_0x14) {
    lVar12 = 0;
    do {
      piVar1[lVar12] = -1;
      lVar12 = lVar12 + 1;
      root = local_24c;
    } while (lVar12 < *(int *)&(this->super_Propagator).field_0x14);
  }
  piVar1[root] = 0;
  this->lowlink[(int)local_24c] = 0;
  this->nodesSeen = 1;
  local_1f8 = &this->propQueue;
  if ((this->propQueue).data != (PROP *)0x0) {
    local_1f8->sz = 0;
  }
  pIVar15 = this->x[(int)local_24c].var;
  iVar9 = (pIVar15->min).v;
  local_1f0 = &local_138.data;
  local_248 = 0;
  iVar10 = 0;
  local_48 = pvVar17;
  local_40 = pIVar15;
  do {
    lVar12 = (long)iVar9;
    if (this->index[lVar12] == -1) {
      local_214 = 0;
      local_38 = lVar12;
      bVar4 = exploreSubtree(this,iVar9,(int)local_248,iVar10,&local_23c,&local_240,&local_214);
      if (!bVar4) goto LAB_001417c4;
      if (local_2a8.data != (int *)0x0) {
        local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
      }
      if ((this->later).data != (int *)0x0) {
        pvVar21->sz = 0;
      }
      local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffff00000000);
      if (0 < *(int *)&(this->super_Propagator).field_0x14) {
        iVar6 = 0;
        do {
          pvVar16 = pvVar21;
          if ((this->index[iVar6] < 0) || (pvVar16 = &local_2a8, iVar10 < this->index[iVar6])) {
            vec<int>::push(pvVar16,(int *)local_298);
          }
          iVar6 = local_298._0_4_ + 1;
          local_298._0_4_ = iVar6;
        } while (iVar6 < *(int *)&(this->super_Propagator).field_0x14);
      }
      uVar23 = local_2a8._0_8_ & 0xffffffff;
      local_68.sz = local_2a8.sz;
      local_68.cap = local_2a8.sz;
      local_54 = iVar9;
      local_68.data = (int *)malloc(uVar23 * 4);
      if (uVar23 != 0) {
        uVar14 = 0;
        do {
          local_68.data[uVar14] = local_2a8.data[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar23 != uVar14);
      }
      LVar7 = getEvidenceLit(this,&local_68);
      if (local_68.data != (int *)0x0) {
        free(local_68.data);
      }
      local_68.data = (int *)0x0;
      local_78.sz = pvVar17->sz;
      uVar23 = (ulong)local_78.sz;
      local_78.cap = local_78.sz;
      local_78.data = (int *)malloc(uVar23 * 4);
      if (uVar23 != 0) {
        piVar1 = (this->prev).data;
        uVar14 = 0;
        do {
          local_78.data[uVar14] = piVar1[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar23 != uVar14);
      }
      LVar8 = getEvidenceLit(this,&local_78);
      if (local_78.data != (int *)0x0) {
        free(local_78.data);
      }
      local_78.data = (int *)0x0;
      local_278.sz = 0;
      local_278.cap = 0;
      local_278.data = (int *)0x0;
      if (pvVar17->sz == 0) {
        local_27c = LVar7.x;
        if (pvVar21->sz != 0) {
          lVar12 = 0;
          uVar23 = 0;
          do {
            vec<int>::push(&local_278,(int *)((long)(this->later).data + lVar12));
            uVar23 = uVar23 + 1;
            lVar12 = lVar12 + 4;
          } while (uVar23 < (this->later).sz);
        }
        vec<int>::push(&local_278,(int *)&local_24c);
        uVar23 = local_278._0_8_ & 0xffffffff;
        local_88.sz = local_278.sz;
        local_88.cap = local_278.sz;
        local_88.data = (int *)malloc(uVar23 * 4);
        if (uVar23 != 0) {
          uVar14 = 0;
          do {
            local_88.data[uVar14] = local_278.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar23 != uVar14);
        }
        LVar8 = getEvidenceLit(this,&local_88);
        pvVar17 = local_48;
        LVar7.x = local_27c;
        if (local_88.data != (int *)0x0) {
          free(local_88.data);
        }
        local_88.data = (int *)0x0;
      }
      local_218 = iVar10;
      if (LVar8.x == 1 || LVar7.x == 1) {
LAB_00141036:
        pvVar16 = local_208;
        if (pvVar17->sz != 0) {
          lVar12 = 0;
          uVar23 = 0;
          do {
            vec<int>::push(pvVar16,(int *)((long)(this->prev).data + lVar12));
            uVar23 = uVar23 + 1;
            lVar12 = lVar12 + 4;
          } while (uVar23 < (this->prev).sz);
        }
        if ((this->prev).data != (int *)0x0) {
          pvVar17->sz = 0;
        }
        if (local_2a8.sz != 0) {
          lVar12 = 0;
          uVar23 = 0;
          do {
            vec<int>::push(pvVar17,(int *)((long)local_2a8.data + lVar12));
            uVar23 = uVar23 + 1;
            lVar12 = lVar12 + 4;
          } while (uVar23 < (local_2a8._0_8_ & 0xffffffff));
        }
        local_248 = (ulong)(local_218 + 1);
        local_218 = this->nodesSeen + -1;
        bVar4 = true;
      }
      else {
        if (local_214 != 0) {
          if ((local_214 != 1) || (this->fixReq == false)) goto LAB_00141036;
          if (so.lazy == true) {
            if (pvVar17->sz == 0) {
              iVar9 = local_278.sz * local_2a8.sz + 2;
              local_27c = LVar7.x;
              local_298 = (undefined1  [8])malloc((long)iVar9 * 4 + 8);
              *(uint *)local_298 = iVar9 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
              auVar24 = local_298;
              if ((*(uint *)local_298 < 0x200) ||
                 (*(int *)((long)local_298 + 8) = local_27c, *(uint *)local_298 < 0x300))
              goto LAB_001417e9;
              ((Clause *)((long)local_298 + 8))->data[0].x = LVar8.x;
              uVar23 = local_2a8._0_8_ & 0xffffffff;
              local_118.sz = local_2a8.sz;
              local_118.cap = local_2a8.sz;
              local_118.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                uVar14 = 0;
                do {
                  local_118.data[uVar14] = local_2a8.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              uVar23 = local_278._0_8_ & 0xffffffff;
              local_128.sz = local_278.sz;
              local_128.cap = local_278.sz;
              local_128.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                uVar14 = 0;
                do {
                  local_128.data[uVar14] = local_278.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              explainAcantreachB(this,(Clause *)auVar24,3,&local_118,&local_128,local_23c,local_240)
              ;
              if (local_128.data != (int *)0x0) {
                free(local_128.data);
              }
              local_128.data = (int *)0x0;
              if (local_118.data != (int *)0x0) {
                free(local_118.data);
              }
              local_118.data = (int *)0x0;
            }
            else {
              local_298 = (undefined1  [8])0x0;
              uStack_290 = (int *)0x0;
              lVar12 = 0;
              uVar23 = 0;
              local_27c = LVar7.x;
              local_21c = LVar8.x;
              do {
                vec<int>::push((vec<int> *)local_298,(int *)((long)(this->prev).data + lVar12));
                uVar23 = uVar23 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar23 < (this->prev).sz);
              if (pvVar21->sz != 0) {
                lVar12 = 0;
                uVar23 = 0;
                do {
                  vec<int>::push((vec<int> *)local_298,(int *)((long)(this->later).data + lVar12));
                  uVar23 = uVar23 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar23 < (this->later).sz);
              }
              local_268._0_8_ = (Clause *)0x0;
              local_268.data = (int *)0x0;
              local_210 = pvVar21;
              if (local_298._0_4_ != 0) {
                lVar12 = 0;
                uVar23 = 0;
                do {
                  vec<int>::push(&local_268,(int *)((long)uStack_290 + lVar12));
                  uVar23 = uVar23 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar23 < ((ulong)local_298 & 0xffffffff));
              }
              if (local_2a8.sz == 0) {
LAB_00140bf2:
                local_238.data = (int *)0x0;
                local_238.sz = 0;
                local_238.cap = 0;
                uVar20 = 0;
              }
              else {
                lVar12 = 0;
                uVar23 = 0;
                do {
                  vec<int>::push(&local_268,(int *)((long)local_2a8.data + lVar12));
                  uVar23 = uVar23 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar23 < (local_2a8._0_8_ & 0xffffffff));
                local_238.sz = 0;
                local_238.cap = 0;
                local_238.data = (int *)0x0;
                if (local_2a8.sz == 0) goto LAB_00140bf2;
                lVar12 = 0;
                uVar23 = 0;
                do {
                  vec<int>::push(&local_238,(int *)((long)local_2a8.data + lVar12));
                  uVar23 = uVar23 + 1;
                  lVar12 = lVar12 + 4;
                  uVar20 = local_2a8.sz;
                } while (uVar23 < (local_2a8._0_8_ & 0xffffffff));
              }
              if (local_210->sz != 0) {
                lVar12 = 0;
                uVar23 = 0;
                do {
                  vec<int>::push(&local_238,(int *)((long)(this->later).data + lVar12));
                  uVar23 = uVar23 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar23 < (this->later).sz);
                uVar20 = local_2a8.sz;
              }
              uVar13 = local_268.sz * local_208->sz;
              local_248 = (ulong)uVar13;
              uVar19 = local_238.sz * pvVar17->sz;
              iVar9 = uVar20 * local_298._0_4_ + uVar13 + uVar19 + 2;
              local_200 = (Clause *)malloc((long)iVar9 * 4 + 8);
              *(uint *)local_200 = iVar9 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_200);
              auVar24 = (undefined1  [8])local_200;
              pvVar21 = local_210;
              if ((*(uint *)local_200 < 0x200) ||
                 (*(int *)(local_200 + 1) = local_27c, local_50 = (ulong)uVar19,
                 *(uint *)local_200 < 0x300)) goto LAB_001417e9;
              local_200[1].data[0].x = local_21c;
              local_138.sz = local_208->sz;
              uVar23 = (ulong)local_138.sz;
              local_138.cap = local_138.sz;
              local_138.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                piVar1 = (this->earlier).data;
                uVar14 = 0;
                do {
                  local_138.data[uVar14] = piVar1[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              uVar23 = local_268._0_8_ & 0xffffffff;
              local_148.sz = local_268.sz;
              local_148.cap = local_268.sz;
              local_148.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                uVar14 = 0;
                do {
                  local_148.data[uVar14] = local_268.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              explainAcantreachB(this,(Clause *)auVar24,3,&local_138,&local_148,-1,-1);
              if (local_148.data != (int *)0x0) {
                free(local_148.data);
              }
              local_148.data = (int *)0x0;
              if (local_138.data != (int *)0x0) {
                free(local_138.data);
              }
              local_138.data = (int *)0x0;
              local_158.sz = pvVar17->sz;
              uVar23 = (ulong)local_158.sz;
              local_158.cap = local_158.sz;
              local_158.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                piVar1 = (this->prev).data;
                uVar14 = 0;
                do {
                  local_158.data[uVar14] = piVar1[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              uVar23 = local_238._0_8_ & 0xffffffff;
              local_168.sz = local_238.sz;
              local_168.cap = local_238.sz;
              local_168.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                uVar14 = 0;
                do {
                  local_168.data[uVar14] = local_238.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              uVar20 = (int)local_248 + 3;
              explainAcantreachB(this,(Clause *)auVar24,uVar20,&local_158,&local_168,-1,-1);
              if (local_168.data != (int *)0x0) {
                free(local_168.data);
              }
              local_168.data = (int *)0x0;
              local_248 = (ulong)uVar20;
              if (local_158.data != (int *)0x0) {
                free(local_158.data);
              }
              local_158.data = (int *)0x0;
              uVar23 = local_2a8._0_8_ & 0xffffffff;
              local_178.sz = local_2a8.sz;
              local_178.cap = local_2a8.sz;
              local_178.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                uVar14 = 0;
                do {
                  local_178.data[uVar14] = local_2a8.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              uVar23 = (ulong)local_298 & 0xffffffff;
              local_188.sz = local_298._0_4_;
              local_188.cap = local_298._0_4_;
              local_188.data = (int *)malloc(uVar23 * 4);
              if (uVar23 != 0) {
                uVar14 = 0;
                do {
                  local_188.data[uVar14] = uStack_290[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar23 != uVar14);
              }
              explainAcantreachB(this,(Clause *)auVar24,(int)local_50 + (int)local_248,&local_178,
                                 &local_188,local_23c,local_240);
              if (local_188.data != (int *)0x0) {
                free(local_188.data);
              }
              local_188.data = (int *)0x0;
              if (local_178.data != (int *)0x0) {
                free(local_178.data);
              }
              local_178.data = (int *)0x0;
              if (local_238.data != (int *)0x0) {
                free(local_238.data);
              }
              if (local_268.data != (int *)0x0) {
                free(local_268.data);
              }
              if (uStack_290 != (int *)0x0) {
                free(uStack_290);
              }
            }
          }
          else {
            auVar24 = (undefined1  [8])0x0;
          }
          uStack_290 = (int *)CONCAT44(local_240,local_23c);
          local_288 = true;
          local_298 = auVar24;
          vec<SubCircuit<0>::PROP>::push(local_1f8,(PROP *)local_298);
          goto LAB_00141036;
        }
        if (so.lazy == true) {
          if (pvVar17->sz == 0) {
            iVar9 = local_278.sz * local_2a8.sz + 2;
            local_27c = LVar7.x;
            local_298 = (undefined1  [8])malloc((long)iVar9 * 4 + 8);
            *(uint *)local_298 = iVar9 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
            auVar24 = local_298;
            if ((*(uint *)local_298 < 0x200) ||
               (*(int *)((long)local_298 + 8) = local_27c, *(uint *)local_298 < 0x300))
            goto LAB_001417e9;
            ((Clause *)((long)local_298 + 8))->data[0].x = LVar8.x;
            uVar23 = local_2a8._0_8_ & 0xffffffff;
            local_98.sz = local_2a8.sz;
            local_98.cap = local_2a8.sz;
            local_98.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              uVar14 = 0;
              do {
                local_98.data[uVar14] = local_2a8.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            uVar23 = local_278._0_8_ & 0xffffffff;
            local_a8.sz = local_278.sz;
            local_a8.cap = local_278.sz;
            local_a8.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              uVar14 = 0;
              do {
                local_a8.data[uVar14] = local_278.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            explainAcantreachB(this,(Clause *)auVar24,3,&local_98,&local_a8,*local_2a8.data,
                               *local_278.data);
            if (local_a8.data != (int *)0x0) {
              free(local_a8.data);
            }
            local_a8.data = (int *)0x0;
            if (local_98.data != (int *)0x0) {
              free(local_98.data);
            }
            local_98.data = (int *)0x0;
            pIVar15 = this->x[*local_2a8.data].var;
            (*(pIVar15->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar15,(long)*local_278.data,auVar24,1);
          }
          else {
            local_298 = (undefined1  [8])0x0;
            uStack_290 = (int *)0x0;
            lVar12 = 0;
            uVar23 = 0;
            local_27c = LVar7.x;
            local_21c = LVar8.x;
            do {
              vec<int>::push((vec<int> *)local_298,(int *)((long)(this->prev).data + lVar12));
              uVar23 = uVar23 + 1;
              lVar12 = lVar12 + 4;
            } while (uVar23 < (this->prev).sz);
            if (pvVar21->sz != 0) {
              lVar12 = 0;
              uVar23 = 0;
              do {
                vec<int>::push((vec<int> *)local_298,(int *)((long)(this->later).data + lVar12));
                uVar23 = uVar23 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar23 < (this->later).sz);
            }
            local_268._0_8_ = (Clause *)0x0;
            local_268.data = (int *)0x0;
            if (local_298._0_4_ != 0) {
              lVar12 = 0;
              uVar23 = 0;
              do {
                vec<int>::push(&local_268,(int *)((long)uStack_290 + lVar12));
                uVar23 = uVar23 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar23 < ((ulong)local_298 & 0xffffffff));
            }
            if (local_2a8.sz == 0) {
LAB_001407a0:
              local_238.data = (int *)0x0;
              local_238.sz = 0;
              local_238.cap = 0;
              uVar20 = 0;
            }
            else {
              lVar12 = 0;
              uVar23 = 0;
              do {
                vec<int>::push(&local_268,(int *)((long)local_2a8.data + lVar12));
                uVar23 = uVar23 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar23 < (local_2a8._0_8_ & 0xffffffff));
              local_238.sz = 0;
              local_238.cap = 0;
              local_238.data = (int *)0x0;
              if (local_2a8.sz == 0) goto LAB_001407a0;
              lVar12 = 0;
              uVar23 = 0;
              do {
                vec<int>::push(&local_238,(int *)((long)local_2a8.data + lVar12));
                uVar23 = uVar23 + 1;
                lVar12 = lVar12 + 4;
                uVar20 = local_2a8.sz;
              } while (uVar23 < (local_2a8._0_8_ & 0xffffffff));
            }
            if (pvVar21->sz != 0) {
              lVar12 = 0;
              uVar23 = 0;
              do {
                vec<int>::push(&local_238,(int *)((long)(this->later).data + lVar12));
                uVar23 = uVar23 + 1;
                lVar12 = lVar12 + 4;
              } while (uVar23 < (this->later).sz);
              uVar20 = local_2a8.sz;
            }
            uVar13 = local_268.sz * local_208->sz;
            iVar10 = local_238.sz * pvVar17->sz;
            iVar9 = uVar20 * local_298._0_4_ + uVar13 + iVar10 + 2;
            local_200 = (Clause *)malloc((long)iVar9 * 4 + 8);
            *(uint *)local_200 = iVar9 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_200);
            pCVar22 = local_200;
            if ((*(uint *)local_200 < 0x200) ||
               (*(int *)(local_200 + 1) = local_27c, local_210 = (vec<int> *)(ulong)uVar13,
               *(uint *)local_200 < 0x300)) goto LAB_001417e9;
            local_200[1].data[0].x = local_21c;
            local_b8.sz = local_208->sz;
            uVar23 = (ulong)local_b8.sz;
            local_b8.cap = local_b8.sz;
            local_b8.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              piVar1 = (this->earlier).data;
              uVar14 = 0;
              do {
                local_b8.data[uVar14] = piVar1[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            uVar23 = local_268._0_8_ & 0xffffffff;
            local_c8.sz = local_268.sz;
            local_c8.cap = local_268.sz;
            local_c8.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              uVar14 = 0;
              do {
                local_c8.data[uVar14] = local_268.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            explainAcantreachB(this,pCVar22,3,&local_b8,&local_c8,-1,-1);
            if (local_c8.data != (int *)0x0) {
              free(local_c8.data);
            }
            local_c8.data = (int *)0x0;
            if (local_b8.data != (int *)0x0) {
              free(local_b8.data);
            }
            local_b8.data = (int *)0x0;
            local_d8.sz = pvVar17->sz;
            uVar23 = (ulong)local_d8.sz;
            local_d8.cap = local_d8.sz;
            local_d8.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              piVar1 = (this->prev).data;
              uVar14 = 0;
              do {
                local_d8.data[uVar14] = piVar1[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            uVar23 = local_238._0_8_ & 0xffffffff;
            local_e8.sz = local_238.sz;
            local_e8.cap = local_238.sz;
            local_e8.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              uVar14 = 0;
              do {
                local_e8.data[uVar14] = local_238.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            uVar20 = (int)local_210 + 3;
            explainAcantreachB(this,pCVar22,uVar20,&local_d8,&local_e8,-1,-1);
            if (local_e8.data != (int *)0x0) {
              free(local_e8.data);
            }
            local_e8.data = (int *)0x0;
            local_210 = (vec<int> *)(ulong)uVar20;
            if (local_d8.data != (int *)0x0) {
              free(local_d8.data);
            }
            local_d8.data = (int *)0x0;
            uVar23 = local_2a8._0_8_ & 0xffffffff;
            local_f8.sz = local_2a8.sz;
            local_f8.cap = local_2a8.sz;
            local_f8.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              uVar14 = 0;
              do {
                local_f8.data[uVar14] = local_2a8.data[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            uVar23 = (ulong)local_298 & 0xffffffff;
            local_108.sz = local_298._0_4_;
            local_108.cap = local_298._0_4_;
            local_108.data = (int *)malloc(uVar23 * 4);
            if (uVar23 != 0) {
              uVar14 = 0;
              do {
                local_108.data[uVar14] = uStack_290[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            explainAcantreachB(this,pCVar22,iVar10 + (int)local_210,&local_f8,&local_108,
                               *local_2a8.data,*uStack_290);
            if (local_108.data != (int *)0x0) {
              free(local_108.data);
            }
            local_108.data = (int *)0x0;
            if (local_f8.data != (int *)0x0) {
              free(local_f8.data);
            }
            local_f8.data = (int *)0x0;
            pIVar15 = this->x[*local_2a8.data].var;
            (*(pIVar15->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar15,(long)*uStack_290,pCVar22,1);
            if (local_238.data != (int *)0x0) {
              free(local_238.data);
            }
            if (local_268.data != (int *)0x0) {
              free(local_268.data);
            }
            if (uStack_290 != (int *)0x0) {
              free(uStack_290);
            }
          }
        }
        bVar4 = false;
      }
      if (local_278.data != (int *)0x0) {
        free(local_278.data);
      }
      lVar12 = local_38;
      pIVar15 = local_40;
      iVar9 = local_54;
      iVar10 = local_218;
      if (!bVar4) goto LAB_001417c4;
    }
    if (iVar9 == (pIVar15->max).v) break;
    lVar11 = 0;
    do {
      lVar3 = lVar11 + lVar12 + 1;
      lVar11 = lVar11 + 1;
    } while (pIVar15->vals[lVar3].v == '\0');
    iVar9 = iVar9 + (int)lVar11;
  } while (-0x80000000 - lVar12 != lVar11);
  iVar9 = *(int *)&(this->super_Propagator).field_0x14;
  iVar10 = this->nodesSeen;
  uVar20 = (uint)local_248;
  if (iVar10 != iVar9) {
    local_298 = (undefined1  [8])0x0;
    uStack_290 = (int *)0x0;
    local_278.sz = 0;
    local_278.cap = 0;
    local_278.data = (int *)0x0;
    local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
    if (iVar9 < 1) {
      uVar13 = 0;
    }
    else {
      iVar10 = 0;
      do {
        pvVar17 = &local_278;
        if (-1 < this->index[iVar10]) {
          pvVar17 = (vec<int> *)local_298;
        }
        vec<int>::push(pvVar17,(int *)&local_268);
        iVar10 = local_268.sz + 1;
        local_268.sz = iVar10;
        iVar9 = *(int *)&(this->super_Propagator).field_0x14;
      } while (iVar10 < iVar9);
      iVar10 = this->nodesSeen;
      uVar20 = (uint)local_248;
      uVar13 = local_298._0_4_;
    }
    local_198.sz = uVar13;
    local_198.cap = uVar13;
    local_198.data = (int *)malloc((ulong)uVar13 * 4);
    if (uVar13 != 0) {
      uVar23 = 0;
      do {
        local_198.data[uVar23] = uStack_290[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar13 != uVar23);
    }
    LVar7 = getEvidenceLit(this,&local_198);
    if (local_198.data != (int *)0x0) {
      free(local_198.data);
    }
    local_198.data = (int *)0x0;
    bVar4 = true;
    if (LVar7.x != 1) {
      if (so.lazy == true) {
        lVar12 = (long)(iVar9 - iVar10) * (long)this->nodesSeen;
        local_268._0_8_ = malloc(lVar12 * 4 + 0x10);
        *(uint *)local_268._0_8_ = ((int)lVar12 + 2) * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_268);
        pCVar22 = (Clause *)local_268._0_8_;
        if (*(uint *)local_268._0_8_ < 0x200) goto LAB_001417e9;
        *(int *)(local_268._0_8_ + 8) = LVar7.x;
        uVar23 = (ulong)local_298 & 0xffffffff;
        local_1a8.sz = local_298._0_4_;
        local_1a8.cap = local_298._0_4_;
        local_1a8.data = (int *)malloc(uVar23 * 4);
        if (uVar23 != 0) {
          uVar14 = 0;
          do {
            local_1a8.data[uVar14] = uStack_290[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar23 != uVar14);
        }
        uVar23 = local_278._0_8_ & 0xffffffff;
        local_1b8.sz = local_278.sz;
        local_1b8.cap = local_278.sz;
        local_1b8.data = (int *)malloc(uVar23 * 4);
        if (uVar23 != 0) {
          uVar14 = 0;
          do {
            local_1b8.data[uVar14] = local_278.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar23 != uVar14);
        }
        explainAcantreachB(this,pCVar22,2,&local_1a8,&local_1b8,-1,-1);
        if (local_1b8.data != (int *)0x0) {
          free(local_1b8.data);
        }
        local_1b8.data = (int *)0x0;
        if (local_1a8.data != (int *)0x0) {
          free(local_1a8.data);
        }
        local_1a8.data = (int *)0x0;
      }
      else {
        pCVar22 = (Clause *)0x0;
      }
      uVar23 = local_278._0_8_ & 0xffffffff;
      if (local_278.sz != 0) {
        uVar14 = 0;
        do {
          iVar9 = local_278.data[uVar14];
          pIVar15 = this->x[iVar9].var;
          iVar10 = (pIVar15->min).v;
          if ((iVar10 != iVar9) || (iVar10 != (pIVar15->max).v)) {
            iVar9 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0x10])
                              (pIVar15,(long)iVar9,pCVar22,1);
            if ((char)iVar9 == '\0') {
              bVar4 = false;
              break;
            }
            uVar23 = local_278._0_8_ & 0xffffffff;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar23);
      }
    }
    if (local_278.data != (int *)0x0) {
      free(local_278.data);
    }
    if (uStack_290 != (int *)0x0) {
      free(uStack_290);
    }
    if (!bVar4) {
LAB_001417c4:
      bVar4 = false;
      goto LAB_001417c6;
    }
  }
  pvVar18 = local_1f8;
  if ((this->pruneRoot == true) && (1 < (int)uVar20)) {
    local_278.sz = 0;
    local_278.cap = 0;
    local_278.data = (int *)0x0;
    local_268._0_8_ = (Clause *)0x0;
    local_268.data = (int *)0x0;
    local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffff00000000);
    if (*(int *)&(this->super_Propagator).field_0x14 < 1) {
      uVar13 = 0;
    }
    else {
      iVar9 = 0;
      do {
        pvVar17 = &local_278;
        if ((uVar20 <= (uint)this->index[iVar9]) || (pvVar17 = &local_268, this->index[iVar9] != 0))
        {
          vec<int>::push(pvVar17,(int *)local_298);
        }
        iVar9 = local_298._0_4_ + 1;
        local_298._0_4_ = iVar9;
      } while (iVar9 < *(int *)&(this->super_Propagator).field_0x14);
      uVar13 = local_278.sz;
    }
    local_1c8.sz = uVar13;
    local_1c8.cap = uVar13;
    local_1c8.data = (int *)malloc((ulong)uVar13 * 4);
    if (uVar13 != 0) {
      uVar23 = 0;
      do {
        local_1c8.data[uVar23] = local_278.data[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar13 != uVar23);
    }
    LVar7 = getEvidenceLit(this,&local_1c8);
    if (local_1c8.data != (int *)0x0) {
      free(local_1c8.data);
    }
    local_1c8.data = (int *)0x0;
    if (LVar7.x != 1) {
      if (so.lazy == true) {
        iVar9 = local_278.sz * local_268.sz + 2;
        local_298 = (undefined1  [8])malloc((long)iVar9 * 4 + 8);
        *(uint *)local_298 = iVar9 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
        auVar24 = local_298;
        if (*(uint *)local_298 < 0x200) {
LAB_001417e9:
          abort();
        }
        *(int *)((long)local_298 + 8) = LVar7.x;
        uVar23 = local_268._0_8_ & 0xffffffff;
        local_1d8.sz = local_268.sz;
        local_1d8.cap = local_268.sz;
        local_1d8.data = (int *)malloc(uVar23 * 4);
        if (uVar23 != 0) {
          uVar14 = 0;
          do {
            local_1d8.data[uVar14] = local_268.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar23 != uVar14);
        }
        uVar23 = local_278._0_8_ & 0xffffffff;
        local_1e8.sz = local_278.sz;
        local_1e8.cap = local_278.sz;
        local_1e8.data = (int *)malloc(uVar23 * 4);
        if (uVar23 != 0) {
          uVar14 = 0;
          do {
            local_1e8.data[uVar14] = local_278.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar23 != uVar14);
        }
        explainAcantreachB(this,(Clause *)auVar24,2,&local_1d8,&local_1e8,-1,-1);
        if (local_1e8.data != (int *)0x0) {
          free(local_1e8.data);
        }
        local_1e8.data = (int *)0x0;
        if (local_1d8.data != (int *)0x0) {
          free(local_1d8.data);
        }
        local_1d8.data = (int *)0x0;
      }
      else {
        auVar24 = (undefined1  [8])0x0;
      }
      iVar9 = *(int *)&(this->super_Propagator).field_0x14;
      if (0 < iVar9) {
        uVar23 = 0;
        do {
          if ((uVar23 != local_24c) && (this->index[uVar23] < (int)uVar20)) {
            uStack_290 = (int *)CONCAT44((int)uVar23,local_24c);
            local_288 = false;
            local_298 = auVar24;
            vec<SubCircuit<0>::PROP>::push(local_1f8,(PROP *)local_298);
            iVar9 = *(int *)&(this->super_Propagator).field_0x14;
          }
          uVar23 = uVar23 + 1;
        } while ((long)uVar23 < (long)iVar9);
      }
    }
    if (local_268.data != (int *)0x0) {
      free(local_268.data);
    }
    pvVar18 = local_1f8;
    if (local_278.data != (int *)0x0) {
      free(local_278.data);
    }
  }
  bVar4 = true;
  if (pvVar18->sz != 0) {
    lVar12 = 0x10;
    uVar23 = 0;
    do {
      pPVar2 = (this->propQueue).data;
      iVar9 = *(int *)((long)pPVar2 + lVar12 + -4);
      if ((*(byte *)((long)&pPVar2->reason + lVar12) & 1) == 0) {
        pIVar15 = this->x[*(int *)((long)pPVar2 + lVar12 + -8)].var;
        if ((((pIVar15->min).v <= iVar9) && (iVar9 <= (pIVar15->max).v)) &&
           ((pIVar15->vals == (Tchar *)0x0 || (pIVar15->vals[iVar9].v != '\0')))) {
          iVar9 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0x11])
                            (pIVar15,(long)iVar9,*(undefined8 *)((long)pPVar2 + lVar12 + -0x10),1);
          cVar5 = (char)iVar9;
          goto LAB_001417aa;
        }
      }
      else {
        pIVar15 = this->x[*(int *)((long)pPVar2 + lVar12 + -8)].var;
        iVar10 = (pIVar15->min).v;
        if ((iVar10 != iVar9) || (iVar10 != (pIVar15->max).v)) {
          iVar9 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0x10])();
          cVar5 = (char)iVar9;
LAB_001417aa:
          if (cVar5 == '\0') goto LAB_001417c4;
        }
      }
      uVar23 = uVar23 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar23 < pvVar18->sz);
  }
LAB_001417c6:
  if (local_2a8.data != (int *)0x0) {
    free(local_2a8.data);
  }
  return bVar4;
}

Assistant:

bool propagateSCC(int root) {
		int backfrom = 0;  // the last back edge found
		int backto = 0;
		int numback = 0;  // the number of back edges found

		vec<int> thisSubtree;

		thisSubtree.reserve(size);
		prev.clear();
		earlier.clear();
		later.clear();

		assert(!x[root].isFixed() || x[root].getVal() != root);
		for (int i = 0; i < size; i++) {
			index[i] = -1;  // unvisited
		}

		index[root] = 0;  // first node visited
		lowlink[root] = 0;

		nodesSeen = 1;  // only seen root node
		propQueue.clear();

		// original subtree is just the root node
		int startSubtree = 0;
		int endSubtree = 0;

		// explore children of the root node
		for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i) {
			const int child = *i;

			if (index[child] == -1)  // if haven't explored this yet
			{
				numback = 0;
				if (!exploreSubtree(child, startSubtree, endSubtree, &backfrom, &backto, &numback)) {
					// fprintf(stderr, "failed in subtree\n");
					return false;  // fail if we found a scc within the child
				}

				// Find the nodes in the subtree we just explored and the ones still to be explored
				thisSubtree.clear();
				later.clear();
				for (int i = 0; i < size; i++) {
					if (index[i] < 0) {
						later.push(i);
					} else if (index[i] > endSubtree) {
						thisSubtree.push(i);
					}
				}

				const Lit evidenceThis = getEvidenceLit(thisSubtree);
				Lit evidenceOther = getEvidenceLit(prev);
				vec<int> alloutside;
				if (prev.size() == 0) {
					for (unsigned int i = 0; i < later.size(); i++) {
						alloutside.push(later[i]);
					}
					alloutside.push(root);
					evidenceOther = getEvidenceLit(alloutside);
				}

				if (evidenceThis != lit_True && evidenceOther != lit_True) {
					// If there's no edge from the new subtree back to the
					// previous one and both of these groups has
					// a variable definitely in, fail
					if (numback == 0) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.nobackedge++;
						if (so.lazy) {
							// If prev is empty then this is the first subtree,
							// and we just need to say that
							// the nodes in this subtree can't reach the
							// unexplored nodes or the root.
							// This is only a problem if something outside this subtree has to be in.
							if (prev.size() == 0) {
								Clause* r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside
								explainAcantreachB(r, 3, thisSubtree, alloutside, thisSubtree[0], alloutside[0]);
								x[thisSubtree[0]].setVal(alloutside[0], r);

								return false;
							}

							// Assuming we have at least one previous subtree,
							// the reason we're failing is that
							// 1. nodes in earlier subtrees can't reach the
							// previous one this one or unexplored ones,
							// 2. nodes in the previous subtree can't reach
							// this one or unexplored ones,
							// 3. and nodes in this subtree can't reach the
							// previous one or unexplored ones.
							vec<int> prev_later;
							for (unsigned int i = 0; i < prev.size(); i++) {
								prev_later.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prev_later.push(later[i]);
							}
							vec<int> prev_this_later;
							for (unsigned int i = 0; i < prev_later.size(); i++) {
								prev_this_later.push(prev_later[i]);
							}
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								prev_this_later.push(thisSubtree[i]);
							}
							vec<int> this_later;
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								this_later.push(thisSubtree[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								this_later.push(later[i]);
							}

							const int size1 = earlier.size() * prev_this_later.size();
							const int size2 = prev.size() * this_later.size();
							const int size3 = thisSubtree.size() * prev_later.size();
							assert(prev_later.size() > 0);
							Clause* r = Reason_new(size1 + size2 + size3 + 2);
							(*r)[1] = evidenceThis;
							(*r)[2] = evidenceOther;
							// 1. Earlier can't reach prev, this or later
							explainAcantreachB(r, 3, earlier, prev_this_later);

							// 2. Prev can't reach this or later
							explainAcantreachB(r, 3 + size1, prev, this_later);

							// 3. this can't reach prev or later
							explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, thisSubtree[0],
																 prev_later[0]);
							x[thisSubtree[0]].setVal(prev_later[0], r);
						}
						return false;
					}

					// If there's only one, the back edge is required (only propagate if the option is set)
					if (fixReq && numback == 1) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.fixedBackedge++;
						Clause* r = nullptr;
						if (so.lazy) {
							// If this is the first subtree, the reason we're setting this link is that
							// there is no other link between nodes of this subtree to nodes outside the subtree
							// including the root
							if (prev.size() == 0) {
								r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside (except backfrom to backto)
								explainAcantreachB(r, 3, thisSubtree, alloutside, backfrom, backto);
							} else {
								// Otherwise we have at least one previous subtree.
								// The reason is the same as when failing above,
								// but we leave out the one we're setting
								vec<int> prev_later;
								for (unsigned int i = 0; i < prev.size(); i++) {
									prev_later.push(prev[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									prev_later.push(later[i]);
								}
								vec<int> prev_this_later;
								for (unsigned int i = 0; i < prev_later.size(); i++) {
									prev_this_later.push(prev_later[i]);
								}
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									prev_this_later.push(thisSubtree[i]);
								}
								vec<int> this_later;
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									this_later.push(thisSubtree[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									this_later.push(later[i]);
								}

								const int size1 = earlier.size() * prev_this_later.size();
								const int size2 = prev.size() * this_later.size();
								const int size3 = thisSubtree.size() * prev_later.size();
								r = Reason_new(size1 + size2 + size3 + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;

								// 1. Earlier can't reach prev, this or later
								explainAcantreachB(r, 3, earlier, prev_this_later);

								// 2. Prev can't reach this or later
								explainAcantreachB(r, 3 + size1, prev, this_later);

								// 3. this can't reach prev or unexplored (except for the one we're setting)
								explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, backfrom, backto);
							}
						}

						addPropagation(true, backfrom, backto, r);
					}
				}

				// When a new subtree has been explored, update the prev and earlier vectors (only necessary
				// if explaining)
				for (unsigned int i = 0; i < prev.size(); i++) {
					earlier.push(prev[i]);
				}
				prev.clear();
				for (unsigned int i = 0; i < thisSubtree.size(); i++) {
					prev.push(thisSubtree[i]);
				}

				// Set the new subtree boundaries
				startSubtree = endSubtree + 1;
				endSubtree = nodesSeen - 1;
			}
		}

		// If we haven't reached all of the nodes and something we have reached has to
		// be included, then set everything outside to take its own index
		if (nodesSeen != size) {
			vec<int> seen;
			vec<int> notseen;

			for (int var = 0; var < size; var++) {
				if (index[var] >= 0) {
					seen.push(var);
				} else {
					notseen.push(var);
				}
			}
			const int numNotSeen = size - nodesSeen;
			assert(static_cast<int>(seen.size()) == nodesSeen);
			assert(static_cast<int>(notseen.size()) == numNotSeen);

			const Lit evidenceSeen = getEvidenceLit(seen);
			if (evidenceSeen != lit_True) {
				// XXX [AS] Commented following line, because propagator related statistics
				// should be collected within the propagator class.
				// engine.disconnected++;
				Clause* r = nullptr;

				if (so.lazy) {
					// need to say that each seen node doesn't reach any non-seen node
					r = Reason_new(nodesSeen * numNotSeen + 2);
					(*r)[1] = evidenceSeen;
					explainAcantreachB(r, 2, seen, notseen);
				}
				for (unsigned int i = 0; i < notseen.size(); i++) {
					const int outsideVar = notseen[i];
					if (x[outsideVar].setValNotR(outsideVar)) {
						if (!x[outsideVar].setVal(outsideVar, r)) {
							return false;
						}
					}
				}
			}
		}

		// If we're pruning root edges and there was more than one subtree, prune edges from the root to
		// earlier subtrees
		if (pruneRoot && startSubtree > 1) {
			// Check there's evidence
			// First find the nodes in the last subtree (and disconnected nodes) and those in the earlier
			// ones

			vec<int> lastSubtreeAndOutside;
			vec<int> earlierSubtree;
			for (int i = 0; i < size; i++) {
				if (index[i] >= startSubtree || index[i] < 0) {
					lastSubtreeAndOutside.push(i);
				} else if (index[i] > 0) {  // The root is considered in no subtree
					earlierSubtree.push(i);
				} else {
					assert(i == root);
				}
			}
			assert(earlierSubtree.size() > 0);
			assert(earlierSubtree.size() + lastSubtreeAndOutside.size() + 1 ==
						 static_cast<unsigned int>(size));
			const Lit evidenceLast = getEvidenceLit(lastSubtreeAndOutside);
			if (evidenceLast != lit_True) {
				// Build the reason if necessary (it will be the same for all of the pruned edges)
				Clause* r = nullptr;
				if (so.lazy) {
					// Reason should state that no var in an earlier sub tree reaches a var
					// in the last subtree or outside
					r = Reason_new(earlierSubtree.size() * lastSubtreeAndOutside.size() + 2);
					(*r)[1] = evidenceLast;
					explainAcantreachB(r, 2, earlierSubtree, lastSubtreeAndOutside);
				}

				// Prune all edges from the root to nodes in earlier subtrees
				for (int i = 0; i < size; i++) {
					if (i != root && index[i] < startSubtree) {
						addPropagation(false, root, i, r);
					}
				}

				/* for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i)
				 {
						 if(*i != root && index[*i] < startSubtree)
						 {
								 // XXX [AS] Commented following line, because propagator related statistics
								 // should be collected within the propagator class.
								 //engine.prunedRoot++;
								 addPropagation(false, root, *i, r);
						 }
				 }*/
			}
		}

		// Perform the propagations
		for (unsigned int i = 0; i < propQueue.size(); i++) {
			PROP const p = propQueue[i];
			// fprintf(stderr, "propagating\n");
			if (p.fix) {
				if (x[p.var].setValNotR(p.val)) {
					if (!x[p.var].setVal(p.val, p.reason)) {
						return false;
					}
				}
			} else {
				if (x[p.var].remValNotR(p.val)) {
					if (!x[p.var].remVal(p.val, p.reason)) {
						return false;
					}
				}
			}
		}
		return true;
	}